

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::js::anon_unknown_0::FileDeduplicator::AddFile
          (FileDeduplicator *this,string *filename,void *desc,string *error)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
  *this_00;
  iterator iVar1;
  mapped_type *ppvVar2;
  void *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &this->descs_by_filename_;
  local_70 = desc;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
          ::find(&this_00->_M_t,filename);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->descs_by_filename_)._M_t._M_impl.super__Rb_tree_header) {
    if (this->error_on_conflict_ == true) {
      std::operator+(&local_68,"Name conflict: file name ",filename);
      std::operator+(&local_48,&local_68," would be generated by two descriptors");
      std::__cxx11::string::operator=((string *)error,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      return false;
    }
    ppvVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
              ::operator[](this_00,filename);
    std::
    _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
    ::erase(&(this->allowed_descs_)._M_t,ppvVar2);
  }
  ppvVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
            ::operator[](this_00,filename);
  *ppvVar2 = desc;
  std::
  _Rb_tree<void_const*,void_const*,std::_Identity<void_const*>,std::less<void_const*>,std::allocator<void_const*>>
  ::_M_insert_unique<void_const*const&>
            ((_Rb_tree<void_const*,void_const*,std::_Identity<void_const*>,std::less<void_const*>,std::allocator<void_const*>>
              *)&this->allowed_descs_,&local_70);
  return true;
}

Assistant:

bool AddFile(const string& filename, const void* desc, string* error) {
    if (descs_by_filename_.find(filename) != descs_by_filename_.end()) {
      if (error_on_conflict_) {
        *error = "Name conflict: file name " + filename +
                 " would be generated by two descriptors";
        return false;
      }
      allowed_descs_.erase(descs_by_filename_[filename]);
    }

    descs_by_filename_[filename] = desc;
    allowed_descs_.insert(desc);
    return true;
  }